

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O3

int big2_scanPercent(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  byte bVar2;
  char cVar3;
  ulong uVar4;
  int iVar5;
  
  uVar4 = (long)end - (long)ptr;
  if ((long)uVar4 < 2) {
    return -1;
  }
  bVar1 = *ptr;
  iVar5 = 0;
  if (bVar1 < 0xdc) {
    if (bVar1 - 0xd8 < 4) {
LAB_006d8aba:
      iVar5 = 0;
      if (uVar4 < 4) {
        return -2;
      }
      goto switchD_006d8b16_caseD_17;
    }
    if (bVar1 == 0) {
      bVar2 = *(byte *)((long)enc[1].scanners + (ulong)(byte)ptr[1]);
      if (0x14 < bVar2) {
        switch(bVar2) {
        case 0x15:
        case 0x1e:
          goto switchD_006d8b16_caseD_15;
        case 0x16:
        case 0x18:
          goto switchD_006d8b16_caseD_16;
        default:
          goto switchD_006d8b16_caseD_17;
        case 0x1d:
          goto switchD_006d8b16_caseD_1d;
        }
      }
      if (1 < bVar2 - 9) {
        if (bVar2 == 6) {
          if (uVar4 == 2) {
            return -2;
          }
          goto switchD_006d8b16_caseD_17;
        }
        if (bVar2 != 7) goto switchD_006d8b16_caseD_17;
        goto LAB_006d8aba;
      }
switchD_006d8b16_caseD_15:
      iVar5 = 0x16;
      goto switchD_006d8b16_caseD_17;
    }
  }
  else if ((bVar1 - 0xdc < 4) || ((bVar1 == 0xff && (0xfd < (byte)ptr[1]))))
  goto switchD_006d8b16_caseD_17;
switchD_006d8b16_caseD_1d:
  if ((*(uint *)((long)namingBitmap +
                (ulong)((byte)ptr[1] >> 3 & 0x1c | (uint)"\x02\x03\x04\x05\x06\a\b"[bVar1] << 5)) >>
       ((byte)ptr[1] & 0x1f) & 1) != 0) {
switchD_006d8b16_caseD_16:
    uVar4 = uVar4 - 2;
    if ((long)uVar4 < 2) {
      return -1;
    }
    ptr = ptr + 4;
LAB_006d8b87:
    bVar1 = ptr[-2];
    if (0xdb < bVar1) {
      if (bVar1 == 0xff) {
        if ((byte)ptr[-1] < 0xfe) goto switchD_006d8bba_caseD_1d;
      }
      else if (3 < bVar1 - 0xdc) goto switchD_006d8bba_caseD_1d;
      goto switchD_006d8bba_caseD_13;
    }
    if (bVar1 != 0) {
      if (bVar1 - 0xd8 < 4) {
LAB_006d8c72:
        if (uVar4 < 4) {
          return -2;
        }
      }
      else {
switchD_006d8bba_caseD_1d:
        if ((*(uint *)((long)namingBitmap +
                      (ulong)((byte)ptr[-1] >> 3 & 0x1c |
                             (uint)"\x19\x03\x1a\x1b\x1c\x1d\x1e"[bVar1] << 5)) >>
             ((byte)ptr[-1] & 0x1f) & 1) != 0) goto switchD_006d8bba_caseD_16;
      }
      goto switchD_006d8bba_caseD_13;
    }
    cVar3 = *(char *)((long)enc[1].scanners + (ulong)(byte)ptr[-1]);
    switch(cVar3) {
    case '\x12':
      iVar5 = 0x1c;
      break;
    case '\x16':
    case '\x18':
    case '\x19':
    case '\x1a':
    case '\x1b':
      goto switchD_006d8bba_caseD_16;
    case '\x1d':
      goto switchD_006d8bba_caseD_1d;
    default:
      if (cVar3 == '\x06') {
        if (uVar4 == 2) {
          return -2;
        }
      }
      else if (cVar3 == '\a') goto LAB_006d8c72;
    case '\x13':
    case '\x14':
    case '\x15':
    case '\x17':
    case '\x1c':
switchD_006d8bba_caseD_13:
      ptr = ptr + -2;
    }
  }
switchD_006d8b16_caseD_17:
  *nextTokPtr = ptr;
  return iVar5;
switchD_006d8bba_caseD_16:
  uVar4 = uVar4 - 2;
  ptr = ptr + 2;
  if ((long)uVar4 < 2) {
    return -1;
  }
  goto LAB_006d8b87;
}

Assistant:

static int PTRCALL
PREFIX(scanPercent)(const ENCODING *enc, const char *ptr, const char *end,
                    const char **nextTokPtr) {
  REQUIRE_CHAR(enc, ptr, end);
  switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
  case BT_S:
  case BT_LF:
  case BT_CR:
  case BT_PERCNT:
    *nextTokPtr = ptr;
    return XML_TOK_PERCENT;
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
      CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
    case BT_SEMI:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_PARAM_ENTITY_REF;
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}